

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCstrNoCaseEqual
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,size_t lineNumber)

{
  UtestShell *pUVar1;
  bool bVar2;
  byte bVar3;
  TestResult *pTVar4;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  UtestShell *in_stack_fffffffffffffe48;
  SimpleString *in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  UtestShell *in_stack_fffffffffffffe80;
  SimpleString local_150;
  undefined1 local_140 [24];
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  UtestShell *in_stack_fffffffffffffef8;
  StringEqualNoCaseFailure *in_stack_ffffffffffffff00;
  SimpleString *in_stack_ffffffffffffff10;
  UtestShell local_a8 [2];
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pTVar4 = getTestResult(in_stack_fffffffffffffe48);
  (*pTVar4->_vptr_TestResult[10])();
  if ((local_18 != 0) || (local_10 != 0)) {
    if ((local_18 == 0) || (local_10 == 0)) {
      pUVar1 = local_a8;
      SimpleString::SimpleString(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe48 = pUVar1;
      in_stack_fffffffffffffe80 = in_stack_fffffffffffffe48;
      StringEqualNoCaseFailure::StringEqualNoCaseFailure
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 in_stack_ffffffffffffff10);
      (**(code **)(*in_RDI + 0x130))(in_RDI,&local_a8[0].name_);
      StringEqualNoCaseFailure::~StringEqualNoCaseFailure((StringEqualNoCaseFailure *)0x11ef00);
      SimpleString::~SimpleString((SimpleString *)0x11ef0d);
    }
    SimpleString::SimpleString(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
    SimpleString::SimpleString(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
    bVar2 = SimpleString::equalsNoCase
                      ((SimpleString *)in_stack_fffffffffffffe80,
                       (SimpleString *)
                       CONCAT17(in_stack_fffffffffffffe7f,
                                CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)));
    bVar3 = bVar2 ^ 0xff;
    SimpleString::~SimpleString((SimpleString *)0x11efb6);
    SimpleString::~SimpleString((SimpleString *)0x11efc3);
    if ((bVar3 & 1) != 0) {
      SimpleString::SimpleString(&local_150,(char *)in_stack_fffffffffffffe48);
      StringEqualNoCaseFailure::StringEqualNoCaseFailure
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 in_stack_ffffffffffffff10);
      (**(code **)(*in_RDI + 0x130))(in_RDI,local_140);
      StringEqualNoCaseFailure::~StringEqualNoCaseFailure((StringEqualNoCaseFailure *)0x11f06d);
      SimpleString::~SimpleString((SimpleString *)0x11f077);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNoCaseEqual(const char* expected, const char* actual, const char* text, const char* fileName, size_t lineNumber)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(StringEqualNoCaseFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(expected).equalsNoCase(actual))
        failWith(StringEqualNoCaseFailure(this, fileName, lineNumber, expected, actual, text));
}